

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O2

void __thiscall
GraphEditorNodeDeletion::GraphEditorNodeDeletion
          (GraphEditorNodeDeletion *this,sgNodeID_t node,
          vector<long,_std::allocator<long>_> *connected_ends)

{
  vector<long,_std::allocator<long>_> *this_00;
  sgNodeID_t local_20;
  
  this_00 = &(this->super_GraphEditorOperation).input_nodes;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20 = node;
  std::vector<long,std::allocator<long>>::emplace_back<long&>
            ((vector<long,std::allocator<long>> *)this_00,&local_20);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_nodes,this_00);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_ends,connected_ends);
  return;
}

Assistant:

GraphEditorNodeDeletion::GraphEditorNodeDeletion(sgNodeID_t node, const std::vector<sgNodeID_t> &connected_ends){
    input_nodes.emplace_back(node);
    consumed_nodes=input_nodes;
    consumed_ends=connected_ends;
}